

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result)

{
  int iVar1;
  int iVar2;
  Message *pMVar3;
  Rep *pRVar4;
  void *pvVar5;
  key_type *__k;
  Symbol symbol;
  Descriptor *pDVar6;
  string *psVar7;
  string *psVar8;
  void *pvVar9;
  size_t sVar10;
  iterator iVar11;
  anon_union_8_8_13f84498_for_Symbol_2 aVar12;
  anon_union_8_8_13f84498_for_Symbol_2 aVar13;
  long lVar14;
  undefined1 *orig_options;
  long lVar15;
  undefined8 *puVar16;
  anon_union_8_8_13f84498_for_Symbol_2 aVar17;
  string local_288;
  long local_268;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  long local_1a0;
  SubstituteArg local_198;
  SubstituteArg local_168;
  SubstituteArg local_138;
  SubstituteArg local_108;
  SubstituteArg local_d8;
  SubstituteArg local_a8;
  undefined4 local_78;
  undefined4 uStack_74;
  anon_union_8_8_13f84498_for_Symbol_2 aStack_70;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_name_set;
  
  pDVar6 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar6 = (Descriptor *)this->file_;
  }
  psVar7 = AllocateNameString(this,*(string **)(pDVar6 + 8),(proto->name_).ptr_);
  ValidateSymbolName(this,(proto->name_).ptr_,psVar7,&proto->super_Message);
  psVar8 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar8;
  *(string **)((Descriptor *)result + 8) = psVar7;
  *(FileDescriptor **)((Descriptor *)result + 0x10) = this->file_;
  *(Descriptor **)((Descriptor *)result + 0x18) = parent;
  *(undefined2 *)((Descriptor *)result + 0x28) = 0;
  if ((proto->value_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    AddError(this,psVar7,&proto->super_Message,NAME,"Enums must contain at least one value.");
  }
  iVar1 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)((Descriptor *)result + 0x2c) = iVar1;
  pvVar9 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 * 0x28);
  *(void **)((Descriptor *)result + 0x30) = pvVar9;
  if (0 < (proto->value_).super_RepeatedPtrFieldBase.current_size_) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      BuildEnumValue(this,(EnumValueDescriptorProto *)
                          ((proto->value_).super_RepeatedPtrFieldBase.rep_)->elements[lVar15],result
                     ,(EnumValueDescriptor *)(*(long *)((Descriptor *)result + 0x30) + lVar14));
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x28;
    } while (lVar15 < (proto->value_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar1 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)((Descriptor *)result + 0x38) = iVar1;
  pvVar9 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 << 3);
  *(void **)((Descriptor *)result + 0x40) = pvVar9;
  aVar13.enum_descriptor = result;
  if (0 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar14 = 0;
    do {
      pMVar3 = (Message *)
               ((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar14];
      lVar15 = *(long *)((Descriptor *)result + 0x40);
      iVar1 = *(int *)&pMVar3[3].super_MessageLite._vptr_MessageLite;
      *(int *)(lVar15 + lVar14 * 8) = iVar1;
      iVar2 = *(int *)((long)&pMVar3[3].super_MessageLite._vptr_MessageLite + 4);
      *(int *)(lVar15 + 4 + lVar14 * 8) = iVar2;
      if (iVar2 < iVar1) {
        pDVar6 = (Descriptor *)result + 8;
        result = aVar13.enum_descriptor;
        AddError(this,*(string **)pDVar6,pMVar3,NUMBER,
                 "Reserved range end number must be greater than start number.");
        aVar13.enum_descriptor = result;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar1 = (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)((Descriptor *)result + 0x3c) = iVar1;
  pvVar9 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 * 8);
  *(void **)(aVar13.descriptor + 0x48) = pvVar9;
  if (0 < (long)iVar1) {
    lVar14 = 0;
    do {
      psVar7 = DescriptorPool::Tables::AllocateString
                         (this->tables_,
                          (string *)
                          ((proto->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements
                          [lVar14]);
      *(string **)(*(long *)(aVar13.descriptor + 0x48) + lVar14 * 8) = psVar7;
      lVar14 = lVar14 + 1;
    } while (iVar1 != lVar14);
  }
  aVar17 = aVar13;
  CheckEnumValueUniqueness(this,proto,aVar13.enum_descriptor);
  aVar12 = aVar17;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(aVar13.descriptor + 0x20) = 0;
    aStack_70 = aVar13;
  }
  else {
    orig_options = (undefined1 *)proto->options_;
    if ((EnumOptions *)orig_options == (EnumOptions *)0x0) {
      orig_options = _EnumOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::EnumDescriptor>
              (this,(OptionsType *)orig_options,aVar17.enum_descriptor,3);
    aStack_70 = aVar17;
  }
  local_78 = 4;
  symbol._4_4_ = uStack_74;
  symbol.type = 4;
  symbol.field_1.descriptor = aStack_70.descriptor;
  AddSymbol(this,*(string **)(aStack_70.descriptor + 8),parent,*(string **)aStack_70.descriptor,
            &proto->super_Message,symbol);
  aVar13 = aVar12;
  if (0 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_) {
    local_268 = 2;
    lVar14 = 0;
    do {
      local_1a0 = lVar14 + 1;
      if (local_1a0 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_) {
        pvVar9 = ((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar14];
        lVar15 = local_268;
        do {
          pRVar4 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
          pvVar5 = pRVar4->elements[lVar15 + -1];
          if ((*(int *)((long)pvVar5 + 0x18) <= *(int *)((long)pvVar9 + 0x1c)) &&
             (*(int *)((long)pvVar9 + 0x18) <= *(int *)((long)pvVar5 + 0x1c))) {
            psVar7 = *(string **)(aVar12.descriptor + 8);
            pMVar3 = (Message *)pRVar4->elements[lVar14];
            reserved_name_set._M_h._M_buckets =
                 (__buckets_ptr)
                 FastInt32ToBuffer(*(int32 *)((long)pvVar5 + 0x18),
                                   (char *)((long)&reserved_name_set._M_h._M_bucket_count + 4));
            sVar10 = strlen((char *)reserved_name_set._M_h._M_buckets);
            reserved_name_set._M_h._M_bucket_count =
                 CONCAT44(reserved_name_set._M_h._M_bucket_count._4_4_,(int)sVar10);
            local_260.text_ = FastInt32ToBuffer(*(int32 *)((long)pvVar5 + 0x1c),local_260.scratch_);
            sVar10 = strlen(local_260.text_);
            local_260.size_ = (int)sVar10;
            local_200.text_ = FastInt32ToBuffer(*(int32 *)((long)pvVar9 + 0x18),local_200.scratch_);
            sVar10 = strlen(local_200.text_);
            local_200.size_ = (int)sVar10;
            local_1d0.text_ = FastInt32ToBuffer(*(int32 *)((long)pvVar9 + 0x1c),local_1d0.scratch_);
            sVar10 = strlen(local_1d0.text_);
            local_1d0.size_ = (int)sVar10;
            local_a8.text_ = (char *)0x0;
            local_a8.size_ = -1;
            local_d8.text_ = (char *)0x0;
            local_d8.size_ = -1;
            local_108.text_ = (char *)0x0;
            local_108.size_ = -1;
            local_138.text_ = (char *)0x0;
            local_138.size_ = -1;
            local_168.text_ = (char *)0x0;
            local_168.size_ = -1;
            local_198.text_ = (char *)0x0;
            local_198.size_ = -1;
            strings::Substitute_abi_cxx11_
                      ((string *)&local_230,
                       (strings *)
                       "Reserved range $0 to $1 overlaps with already-defined range $2 to $3.",
                       (char *)&reserved_name_set,&local_260,&local_200,&local_1d0,&local_a8,
                       &local_d8,&local_108,&local_138,&local_168,&local_198,
                       (SubstituteArg *)aVar13.descriptor);
            aVar12 = aVar13;
            AddError(this,psVar7,pMVar3,NUMBER,(string *)&local_230);
            aVar13 = aVar12;
            if (local_230.text_ != local_230.scratch_ + 4) {
              operator_delete(local_230.text_);
              aVar13 = aVar12;
            }
          }
          iVar1 = (int)lVar15;
          lVar15 = lVar15 + 1;
        } while (iVar1 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
      }
      local_268 = local_268 + 1;
      lVar14 = local_1a0;
    } while (local_1a0 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  reserved_name_set._M_h._M_buckets = &reserved_name_set._M_h._M_single_bucket;
  reserved_name_set._M_h._M_bucket_count = 1;
  reserved_name_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reserved_name_set._M_h._M_element_count = 0;
  reserved_name_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reserved_name_set._M_h._M_rehash_policy._M_next_resize = 0;
  reserved_name_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (0 < (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_) {
    lVar14 = 0;
    do {
      __k = (key_type *)((proto->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[lVar14];
      iVar11 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&reserved_name_set._M_h,__k);
      if (iVar11.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_260.text_ = (char *)&reserved_name_set._M_h;
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&reserved_name_set._M_h,__k,&local_260);
      }
      else {
        local_260.text_ = (__k->_M_dataplus)._M_p;
        local_260.size_ = (int)__k->_M_string_length;
        local_200.text_ = (char *)0x0;
        local_200.size_ = -1;
        local_1d0.text_ = (char *)0x0;
        local_1d0.size_ = -1;
        local_a8.text_ = (char *)0x0;
        local_a8.size_ = -1;
        local_d8.text_ = (char *)0x0;
        local_d8.size_ = -1;
        local_108.text_ = (char *)0x0;
        local_108.size_ = -1;
        local_138.text_ = (char *)0x0;
        local_138.size_ = -1;
        local_168.text_ = (char *)0x0;
        local_168.size_ = -1;
        local_198.text_ = (char *)0x0;
        local_198.size_ = -1;
        local_230.text_ = (char *)0x0;
        local_230.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_288,(strings *)"Enum value \"$0\" is reserved multiple times.",
                   (char *)&local_260,&local_200,&local_1d0,&local_a8,&local_d8,&local_108,
                   &local_138,&local_168,&local_198,&local_230,(SubstituteArg *)aVar13.descriptor);
        AddError(this,__k,&proto->super_Message,NAME,&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < *(int *)(aVar13.descriptor + 0x2c)) {
    lVar14 = 0;
    do {
      puVar16 = (undefined8 *)(lVar14 * 0x28 + *(long *)(aVar13.descriptor + 0x30));
      aVar17 = aVar13;
      if (0 < *(int *)(aVar13.descriptor + 0x38)) {
        lVar15 = 0;
        do {
          if ((*(int *)(*(long *)(aVar13.descriptor + 0x40) + lVar15 * 8) <= *(int *)(puVar16 + 2))
             && (*(int *)(puVar16 + 2) <=
                 *(int *)(*(long *)(aVar13.descriptor + 0x40) + 4 + lVar15 * 8))) {
            psVar7 = (string *)puVar16[1];
            pMVar3 = (Message *)
                     ((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar15];
            local_260.text_ = *(char **)*puVar16;
            local_260.size_ = *(int *)((undefined8 *)*puVar16 + 1);
            local_200.text_ = FastInt32ToBuffer(*(int32 *)(puVar16 + 2),local_200.scratch_);
            sVar10 = strlen(local_200.text_);
            local_200.size_ = (int)sVar10;
            local_1d0.text_ = (char *)0x0;
            local_1d0.size_ = -1;
            local_a8.text_ = (char *)0x0;
            local_a8.size_ = -1;
            local_d8.text_ = (char *)0x0;
            local_d8.size_ = -1;
            local_108.text_ = (char *)0x0;
            local_108.size_ = -1;
            local_138.text_ = (char *)0x0;
            local_138.size_ = -1;
            local_168.text_ = (char *)0x0;
            local_168.size_ = -1;
            local_198.text_ = (char *)0x0;
            local_198.size_ = -1;
            local_230.text_ = (char *)0x0;
            local_230.size_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_288,(strings *)"Enum value \"$0\" uses reserved number $1.",
                       (char *)&local_260,&local_200,&local_1d0,&local_a8,&local_d8,&local_108,
                       &local_138,&local_168,&local_198,&local_230,
                       (SubstituteArg *)aVar17.descriptor);
            aVar13 = aVar17;
            AddError(this,psVar7,pMVar3,NUMBER,&local_288);
            aVar17 = aVar13;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p);
              aVar17 = aVar13;
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)(aVar13.descriptor + 0x38));
      }
      iVar11 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&reserved_name_set._M_h,(key_type *)*puVar16);
      if (iVar11.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        psVar7 = (string *)puVar16[1];
        pMVar3 = (Message *)((proto->value_).super_RepeatedPtrFieldBase.rep_)->elements[lVar14];
        local_260.text_ = *(char **)*puVar16;
        local_260.size_ = *(int *)((undefined8 *)*puVar16 + 1);
        local_200.text_ = (char *)0x0;
        local_200.size_ = -1;
        local_1d0.text_ = (char *)0x0;
        local_1d0.size_ = -1;
        local_a8.text_ = (char *)0x0;
        local_a8.size_ = -1;
        local_d8.text_ = (char *)0x0;
        local_d8.size_ = -1;
        local_108.text_ = (char *)0x0;
        local_108.size_ = -1;
        local_138.text_ = (char *)0x0;
        local_138.size_ = -1;
        local_168.text_ = (char *)0x0;
        local_168.size_ = -1;
        local_198.text_ = (char *)0x0;
        local_198.size_ = -1;
        local_230.text_ = (char *)0x0;
        local_230.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_288,(strings *)"Enum value \"$0\" is reserved.",(char *)&local_260,
                   &local_200,&local_1d0,&local_a8,&local_d8,&local_108,&local_138,&local_168,
                   &local_198,&local_230,(SubstituteArg *)aVar17.descriptor);
        AddError(this,psVar7,pMVar3,NAME,&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
      }
      lVar14 = lVar14 + 1;
      aVar13 = aVar17;
    } while (lVar14 < *(int *)(aVar17.descriptor + 0x2c));
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&reserved_name_set._M_h);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result) {
  const std::string& scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  std::string* full_name = AllocateNameString(scope, proto.name());
  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      tables_->AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] =
        tables_->AllocateString(proto.reserved_name(i));
  }

  CheckEnumValueUniqueness(proto, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    EnumDescriptorProto::kOptionsFieldNumber);
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const EnumDescriptorProto_EnumReservedRange& range1 =
        proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const EnumDescriptorProto_EnumReservedRange& range2 =
          proto.reserved_range(j);
      if (range1.end() >= range2.start() && range2.end() >= range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Reserved range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2.start(), range2.end(),
                                     range1.start(), range1.end()));
      }
    }
  }

  HASH_SET<std::string> reserved_name_set;
  for (int i = 0; i < proto.reserved_name_size(); i++) {
    const std::string& name = proto.reserved_name(i);
    if (reserved_name_set.find(name) == reserved_name_set.end()) {
      reserved_name_set.insert(name);
    } else {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                   "Enum value \"$0\" is reserved multiple times.", name));
    }
  }

  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const EnumDescriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= value->number() && value->number() <= range->end) {
        AddError(
            value->full_name(), proto.reserved_range(j),
            DescriptorPool::ErrorCollector::NUMBER,
            strings::Substitute("Enum value \"$0\" uses reserved number $1.",
                                value->name(), value->number()));
      }
    }
    if (reserved_name_set.find(value->name()) != reserved_name_set.end()) {
      AddError(
          value->full_name(), proto.value(i),
          DescriptorPool::ErrorCollector::NAME,
          strings::Substitute("Enum value \"$0\" is reserved.", value->name()));
    }
  }
}